

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_p.h
# Opt level: O0

void __thiscall
QPaintEnginePrivate::setSystemTransformAndViewport
          (QPaintEnginePrivate *this,QTransform *xform,QRegion *region)

{
  bool bVar1;
  byte bVar2;
  QPaintEnginePrivate *in_RDX;
  void *in_RSI;
  long *in_RDI;
  
  memcpy(in_RDI + 8,in_RSI,0x4a);
  bVar1 = QTransform::isIdentity((QTransform *)0x3889ce);
  *(byte *)(in_RDI + 0x13) = *(byte *)(in_RDI + 0x13) & 0xfe | (bVar1 ^ 0xffU) & 1;
  QRegion::operator=((QRegion *)(in_RDI + 7),(QRegion *)in_RDX);
  bVar2 = QRegion::isEmpty();
  *(byte *)(in_RDI + 0x13) = *(byte *)(in_RDI + 0x13) & 0xfd | ((bVar2 ^ 0xff) & 1) << 1;
  updateSystemClip(in_RDX);
  if (*(long *)(in_RDI[2] + 8) != 0) {
    (**(code **)(*in_RDI + 0x10))();
  }
  return;
}

Assistant:

inline void setSystemTransformAndViewport(const QTransform &xform, const QRegion &region)
    {
        systemTransform = xform;
        hasSystemTransform = !xform.isIdentity();
        systemViewport = region;
        hasSystemViewport = !systemViewport.isEmpty();
        updateSystemClip();
        if (q_ptr->state)
            systemStateChanged();
    }